

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

bool __thiscall
glslang::TSymbolTableLevel::insert
          (TSymbolTableLevel *this,TSymbol *symbol,bool separateNameSpaces,TString *forcedKeyName)

{
  TSymbol *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  size_type sVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString *pTVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  byte extraout_DL;
  byte extraout_DL_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__x_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__x_01;
  bool local_181;
  TSymbol *local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  local_148;
  __enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
  *local_118;
  __enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
  *local_108;
  TSymbol *local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  local_f0;
  _Self local_c0;
  _Self local_b8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_b0;
  TString *insertName;
  char buf [20];
  TSymbol *local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  local_78;
  __enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
  *local_48;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_38;
  TString *name;
  TString *forcedKeyName_local;
  TSymbol *pTStack_20;
  bool separateNameSpaces_local;
  TSymbol *symbol_local;
  TSymbolTableLevel *this_local;
  
  name = forcedKeyName;
  forcedKeyName_local._7_1_ = separateNameSpaces;
  pTStack_20 = symbol;
  symbol_local = (TSymbol *)this;
  iVar3 = (*symbol->_vptr_TSymbol[3])();
  local_38 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             CONCAT44(extraout_var,iVar3);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          length(name);
  if (sVar5 == 0) {
    bVar2 = std::operator==(local_38,"");
    if (bVar2) {
      iVar3 = (*pTStack_20->_vptr_TSymbol[9])();
      this->anonId = this->anonId + 1;
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe0))();
      iVar3 = (*pTStack_20->_vptr_TSymbol[9])();
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xe8))();
      snprintf((char *)&insertName,0x14,"%s%d","anon@",(ulong)uVar4);
      pTVar1 = pTStack_20;
      pTVar6 = NewPoolTString_abi_cxx11_((char *)&insertName);
      (*pTVar1->_vptr_TSymbol[4])(pTVar1,pTVar6);
      this_local._7_1_ = insertAnonymousMembers(this,pTStack_20,0);
    }
    else {
      iVar3 = (*pTStack_20->_vptr_TSymbol[6])();
      local_b0 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_02,iVar3);
      iVar3 = (*pTStack_20->_vptr_TSymbol[7])();
      if (CONCAT44(extraout_var_03,iVar3) == 0) {
        local_150 = pTStack_20;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
        ::pair<glslang::TSymbol_*,_true>(&local_148,local_b0,&local_150);
        local_118 = std::
                    map<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::TSymbol*,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                    ::
                    insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                              ((__enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
                                *)this,&local_148,__x_01);
        this_local._7_1_ = extraout_DL_00 & 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
        ::~pair(&local_148);
      }
      else {
        local_181 = false;
        if ((forcedKeyName_local._7_1_ & 1) == 0) {
          local_b8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
               ::find(&this->level,local_38);
          local_c0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
               ::end(&this->level);
          local_181 = std::operator!=(&local_b8,&local_c0);
        }
        if (local_181 == false) {
          local_f8 = pTStack_20;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
          ::pair<glslang::TSymbol_*,_true>(&local_f0,local_b0,&local_f8);
          local_108 = std::
                      map<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::TSymbol*,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                      ::
                      insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                                ((__enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
                                  *)this,&local_f0,__x_00);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
          ::~pair(&local_f0);
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
  }
  else {
    local_80 = pTStack_20;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
    ::pair<glslang::TSymbol_*,_true>(&local_78,name,&local_80);
    register0x00000000 =
         std::
         map<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::TSymbol*,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
         ::
         insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                   ((__enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
                     *)this,&local_78,__x);
    this_local._7_1_ = extraout_DL & 1;
    local_48 = register0x00000000;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
    ::~pair(&local_78);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool insert(TSymbol& symbol, bool separateNameSpaces, const TString& forcedKeyName = TString())
    {
        //
        // returning true means symbol was added to the table with no semantic errors
        //
        const TString& name = symbol.getName();
        if (forcedKeyName.length()) {
            return level.insert(tLevelPair(forcedKeyName, &symbol)).second;
        }
        else if (name == "") {
            symbol.getAsVariable()->setAnonId(anonId++);
            // An empty name means an anonymous container, exposing its members to the external scope.
            // Give it a name and insert its members in the symbol table, pointing to the container.
            char buf[20];
            snprintf(buf, 20, "%s%d", AnonymousPrefix, symbol.getAsVariable()->getAnonId());
            symbol.changeName(NewPoolTString(buf));

            return insertAnonymousMembers(symbol, 0);
        } else {
            // Check for redefinition errors:
            // - STL itself will tell us if there is a direct name collision, with name mangling, at this level
            // - additionally, check for function-redefining-variable name collisions
            const TString& insertName = symbol.getMangledName();
            if (symbol.getAsFunction()) {
                // make sure there isn't a variable of this name
                if (! separateNameSpaces && level.find(name) != level.end())
                    return false;

                // insert, and whatever happens is okay
                level.insert(tLevelPair(insertName, &symbol));

                return true;
            } else
                return level.insert(tLevelPair(insertName, &symbol)).second;
        }
    }